

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_index_build(char *fn,int min_shift)

{
  htsFile *fp;
  hts_idx_t *idx;
  int iVar1;
  
  fp = hts_open(fn,"rb");
  iVar1 = -1;
  if (fp != (htsFile *)0x0) {
    if ((fp->format).compression == bgzf) {
      idx = bcf_index(fp,min_shift);
      hts_close(fp);
      if (idx != (hts_idx_t *)0x0) {
        iVar1 = 0;
        hts_idx_save(idx,fn,0);
        hts_idx_destroy(idx);
      }
    }
    else {
      hts_close(fp);
    }
  }
  return iVar1;
}

Assistant:

int bcf_index_build(const char *fn, int min_shift)
{
    htsFile *fp;
    hts_idx_t *idx;
    if ((fp = hts_open(fn, "rb")) == 0) return -1;
    if ( fp->format.compression!=bgzf ) { hts_close(fp); return -1; }
    idx = bcf_index(fp, min_shift);
    hts_close(fp);
    if ( !idx ) return -1;
    hts_idx_save(idx, fn, HTS_FMT_CSI);
    hts_idx_destroy(idx);
    return 0;
}